

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O3

size_t duckdb_je_hpdata_purge_begin(hpdata_t *hpdata,hpdata_purge_state_t *purge_state)

{
  fb_group_t *pfVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  fb_group_t fVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  fb_group_t dirty_pages [8];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  lVar7 = 0;
  purge_state->npurged = 0;
  purge_state->next_purge_search_begin = 0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  do {
    pfVar1 = hpdata->active_pages + lVar7;
    uVar4 = *(uint *)((long)pfVar1 + 4);
    fVar6 = pfVar1[1];
    uVar5 = *(uint *)((long)pfVar1 + 0xc);
    lVar11 = lVar7 * 8;
    *(uint *)(local_78 + lVar11) = (uint)*pfVar1 ^ 0xffffffff;
    *(uint *)(local_78 + lVar11 + 4) = uVar4 ^ 0xffffffff;
    *(uint *)(local_78 + lVar11 + 8) = (uint)fVar6 ^ 0xffffffff;
    *(uint *)(local_68 + lVar11 + -4) = uVar5 ^ 0xffffffff;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 8);
  lVar7 = 0;
  do {
    uVar8 = (hpdata->touched_pages + lVar7)[1];
    uVar15 = *(ulong *)(local_78 + lVar7 * 8 + 8);
    *(fb_group_t *)(local_78 + lVar7 * 8) =
         hpdata->touched_pages[lVar7] & *(ulong *)(local_78 + lVar7 * 8);
    *(ulong *)(local_78 + lVar7 * 8 + 8) = uVar8 & uVar15;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 8);
  purge_state->to_purge[6] = 0;
  purge_state->to_purge[7] = 0;
  purge_state->to_purge[4] = 0;
  purge_state->to_purge[5] = 0;
  purge_state->to_purge[2] = 0;
  purge_state->to_purge[3] = 0;
  purge_state->to_purge[0] = 0;
  purge_state->to_purge[1] = 0;
  uVar8 = 0;
  do {
    uVar15 = uVar8 >> 6;
    uVar8 = (*(ulong *)(local_78 + uVar15 * 8) >> ((byte)uVar8 & 0x3f)) << ((byte)uVar8 & 0x3f);
    while (uVar8 == 0) {
      if (uVar15 == 7) goto LAB_01d761ee;
      lVar7 = uVar15 * 8;
      uVar15 = uVar15 + 1;
      uVar8 = *(ulong *)(local_78 + lVar7 + 8);
    }
    uVar12 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
      }
    }
    uVar14 = uVar15 << 6 | uVar12;
    if (uVar14 == 0x200) break;
    uVar15 = uVar15 & 0x3ffffffffffffff;
    bVar3 = (byte)uVar12;
    uVar10 = (hpdata->active_pages[uVar15] >> (bVar3 & 0x3f)) << (bVar3 & 0x3f);
    uVar13 = uVar15;
    while (uVar10 == 0) {
      if (uVar13 == 7) {
        uVar8 = 0x200;
        goto LAB_01d760c2;
      }
      lVar7 = uVar13 + 1;
      uVar13 = uVar13 + 1;
      uVar10 = hpdata->active_pages[lVar7];
    }
    uVar8 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
    uVar8 = uVar13 << 6 | uVar8;
LAB_01d760c2:
    uVar13 = uVar8 - 1 >> 6;
    uVar10 = (2L << ((byte)(uVar8 - 1) & 0x3f)) - 1U & *(ulong *)(local_78 + uVar13 * 8);
    while (uVar10 == 0) {
      bVar16 = uVar13 == 0;
      uVar13 = uVar13 - 1;
      if (bVar16) {
        uVar10 = 0xffffffffffffffff;
        goto LAB_01d76106;
      }
      uVar10 = *(ulong *)(local_78 + uVar13 * 8);
    }
    uVar2 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar10 = (uVar13 << 6 | uVar2 ^ 0x3f) ^ 0x3f;
LAB_01d76106:
    lVar11 = uVar10 - uVar14;
    uVar14 = lVar11 + uVar12 + 1;
    lVar11 = lVar11 + 1;
    lVar7 = 0x40 - uVar12;
    if (uVar14 < 0x41) {
      lVar7 = lVar11;
    }
    uVar12 = lVar11 - lVar7;
    purge_state->to_purge[uVar15] =
         purge_state->to_purge[uVar15] |
         (0xffffffffffffffffU >> (-(char)lVar7 & 0x3fU)) << (bVar3 & 0x3f);
    if (uVar12 < 0x41) {
      lVar7 = uVar15 + 1;
    }
    else {
      uVar12 = 0x40;
      if (uVar14 < 0x40) {
        uVar12 = uVar14;
      }
      uVar13 = (uVar14 - uVar12) - 0x41;
      uVar10 = uVar13 >> 6;
      switchD_012e3010::default(purge_state->to_purge + uVar15 + 1,0xff,uVar10 * 8 + 8);
      uVar12 = (uVar14 - ((uVar13 & 0xffffffffffffffc0) + uVar12)) - 0x40;
      lVar7 = uVar15 + uVar10 + 2;
    }
    if (uVar12 != 0) {
      purge_state->to_purge[lVar7] =
           purge_state->to_purge[lVar7] | 0xffffffffffffffffU >> (-(char)uVar12 & 0x3fU);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 < 0x200);
LAB_01d761ee:
  sVar9 = hpdata->h_ntouched - hpdata->h_nactive;
  purge_state->ndirty_to_purge = sVar9;
  return sVar9;
}

Assistant:

size_t
hpdata_purge_begin(hpdata_t *hpdata, hpdata_purge_state_t *purge_state) {
	hpdata_assert_consistent(hpdata);
	/*
	 * See the comment below; we might purge any inactive extent, so it's
	 * unsafe for any other thread to turn any inactive extent active while
	 * we're operating on it.
	 */
	assert(!hpdata_alloc_allowed_get(hpdata));

	purge_state->npurged = 0;
	purge_state->next_purge_search_begin = 0;

	/*
	 * Initialize to_purge.
	 *
	 * It's possible to end up in situations where two dirty extents are
	 * separated by a retained extent:
	 * - 1 page allocated.
	 * - 1 page allocated.
	 * - 1 pages allocated.
	 *
	 * If the middle page is freed and purged, and then the first and third
	 * pages are freed, and then another purge pass happens, the hpdata
	 * looks like this:
	 * - 1 page dirty.
	 * - 1 page retained.
	 * - 1 page dirty.
	 *
	 * But it's safe to do a single 3-page purge.
	 *
	 * We do this by first computing the dirty pages, and then filling in
	 * any gaps by extending each range in the dirty bitmap to extend until
	 * the next active page.  This purges more pages, but the expensive part
	 * of purging is the TLB shootdowns, rather than the kernel state
	 * tracking; doing a little bit more of the latter is fine if it saves
	 * us from doing some of the former.
	 */

	/*
	 * The dirty pages are those that are touched but not active.  Note that
	 * in a normal-ish case, HUGEPAGE_PAGES is something like 512 and the
	 * fb_group_t is 64 bits, so this is 64 bytes, spread across 8
	 * fb_group_ts.
	 */
	fb_group_t dirty_pages[FB_NGROUPS(HUGEPAGE_PAGES)];
	fb_init(dirty_pages, HUGEPAGE_PAGES);
	fb_bit_not(dirty_pages, hpdata->active_pages, HUGEPAGE_PAGES);
	fb_bit_and(dirty_pages, dirty_pages, hpdata->touched_pages,
	    HUGEPAGE_PAGES);

	fb_init(purge_state->to_purge, HUGEPAGE_PAGES);
	size_t next_bit = 0;
	while (next_bit < HUGEPAGE_PAGES) {
		size_t next_dirty = fb_ffs(dirty_pages, HUGEPAGE_PAGES,
		    next_bit);
		/* Recall that fb_ffs returns nbits if no set bit is found. */
		if (next_dirty == HUGEPAGE_PAGES) {
			break;
		}
		size_t next_active = fb_ffs(hpdata->active_pages,
		    HUGEPAGE_PAGES, next_dirty);
		/*
		 * Don't purge past the end of the dirty extent, into retained
		 * pages.  This helps the kernel a tiny bit, but honestly it's
		 * mostly helpful for testing (where we tend to write test cases
		 * that think in terms of the dirty ranges).
		 */
		ssize_t last_dirty = fb_fls(dirty_pages, HUGEPAGE_PAGES,
		    next_active - 1);
		assert(last_dirty >= 0);
		assert((size_t)last_dirty >= next_dirty);
		assert((size_t)last_dirty - next_dirty + 1 <= HUGEPAGE_PAGES);

		fb_set_range(purge_state->to_purge, HUGEPAGE_PAGES, next_dirty,
		    last_dirty - next_dirty + 1);
		next_bit = next_active + 1;
	}

	/* We should purge, at least, everything dirty. */
	size_t ndirty = hpdata->h_ntouched - hpdata->h_nactive;
	purge_state->ndirty_to_purge = ndirty;
	assert(ndirty <= fb_scount(
	    purge_state->to_purge, HUGEPAGE_PAGES, 0, HUGEPAGE_PAGES));
	assert(ndirty == fb_scount(dirty_pages, HUGEPAGE_PAGES, 0,
	    HUGEPAGE_PAGES));

	hpdata_assert_consistent(hpdata);

	return ndirty;
}